

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.h
# Opt level: O0

Analysis __thiscall
spvtools::opt::EliminateDeadMembersPass::GetPreservedAnalyses(EliminateDeadMembersPass *this)

{
  Analysis AVar1;
  EliminateDeadMembersPass *this_local;
  
  AVar1 = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  AVar1 = opt::operator|(AVar1,kAnalysisCombinators);
  AVar1 = opt::operator|(AVar1,kAnalysisCFG);
  AVar1 = opt::operator|(AVar1,kAnalysisDominatorAnalysis);
  AVar1 = opt::operator|(AVar1,kAnalysisLoopAnalysis);
  AVar1 = opt::operator|(AVar1,kAnalysisScalarEvolution);
  AVar1 = opt::operator|(AVar1,kAnalysisRegisterPressure);
  AVar1 = opt::operator|(AVar1,kAnalysisValueNumberTable);
  AVar1 = opt::operator|(AVar1,kAnalysisStructuredCFG);
  AVar1 = opt::operator|(AVar1,kAnalysisBuiltinVarId);
  AVar1 = opt::operator|(AVar1,kAnalysisIdToFuncMapping);
  return AVar1;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisCombinators | IRContext::kAnalysisCFG |
           IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisLoopAnalysis |
           IRContext::kAnalysisScalarEvolution |
           IRContext::kAnalysisRegisterPressure |
           IRContext::kAnalysisValueNumberTable |
           IRContext::kAnalysisStructuredCFG |
           IRContext::kAnalysisBuiltinVarId |
           IRContext::kAnalysisIdToFuncMapping;
  }